

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::SkipMessageSetField
               (CodedInputStream *input,uint32 field_number,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  uint32 *in_RDX;
  int in_ESI;
  UnknownFieldSet *in_RDI;
  uint32 length;
  int in_stack_0000004c;
  string *in_stack_00000050;
  CodedInputStream *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  bVar1 = io::CodedInputStream::ReadVarint32
                    ((CodedInputStream *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  if (bVar1) {
    UnknownFieldSet::AddLengthDelimited_abi_cxx11_(in_RDI,in_ESI);
    local_1 = io::CodedInputStream::ReadString
                        (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool WireFormat::SkipMessageSetField(io::CodedInputStream* input,
                                     uint32 field_number,
                                     UnknownFieldSet* unknown_fields) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  return input->ReadString(unknown_fields->AddLengthDelimited(field_number),
                           length);
}